

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,"Usage: %s COMMAND [OPTIONS] <<filename>.<suffix> | <absolute_filename_path>>\n\n"
          ,utilname);
  fprintf(_stderr,"If <absolute_filename_path> (begins with \"/\") is given, only this\n");
  fprintf(_stderr,"file will be parsed.\n");
  fprintf(_stderr,"Otherwise different files in /etc /usr/vendor and */<filename>.suffix.d/\n");
  fprintf(_stderr,"directories will be parsed.\n\n");
  fprintf(_stderr,"COMMANDS:\n");
  fprintf(_stderr,"show     reads all snippets for <filename>.conf (in /usr/etc and /etc),\n");
  fprintf(_stderr,"         and prints all groups,keys and their values.\n");
  fprintf(_stderr,"         The root directories is /. It can be set by the environment\n");
  fprintf(_stderr,"         variable $ECONFTOOL_ROOT \n");
  fprintf(_stderr,"cat      prints the content of the files and the name of the file in the order\n"
         );
  fprintf(_stderr,"         as it has been read.\n");
  fprintf(_stderr,"syntax   checks the syntax, prints parsing errors and returns 1 if an error\n");
  fprintf(_stderr,"         has been found (otherwise 0).\n");
  fprintf(_stderr,"         as it has been read.\n");
  fprintf(_stderr,"edit     starts the editor $EDITOR (environment variable) where the\n");
  fprintf(_stderr,"         groups, keys and values can be modified and saved afterwards.\n");
  fprintf(_stderr,"  -f, --full:      copy the original configuration file to /etc instead of\n");
  fprintf(_stderr,"                   creating drop-in files.\n");
  fprintf(_stderr,"  --use-home:      only has an effect if the user is root.\n");
  fprintf(_stderr,"                   chooses the root home directory instead of /etc.\n");
  fprintf(_stderr,"revert   reverts all changes to the vendor versions. Basically deletes\n");
  fprintf(_stderr,"         the config file and snippet directory in /etc.\n");
  fprintf(_stderr,"  -y, --yes:       assumes yes for all prompts and runs non-interactively.\n\n");
  fprintf(_stderr,"\ngeneral Options:\n");
  fprintf(_stderr,"--comment <character>: Character which starts a comment. (\'#\' default).\n");
  fprintf(_stderr,
          "--delimiters <string>: Characters which separates key/value entries. (\"=\" default).\n")
  ;
  fprintf(_stderr,"                       e.g. --delimiters=\"= \\t\"\n");
  fprintf(_stderr,"                       e.g. --delimiters=spaces   regarding all spaces\n");
  return;
}

Assistant:

static void usage(void)
{
    fprintf(stderr, "Usage: %s COMMAND [OPTIONS] <<filename>.<suffix> | <absolute_filename_path>>\n\n", utilname);
    fprintf(stderr, "If <absolute_filename_path> (begins with \"/\") is given, only this\n");
    fprintf(stderr, "file will be parsed.\n");
    fprintf(stderr, "Otherwise different files in /etc /usr/vendor and */<filename>.suffix.d/\n");
    fprintf(stderr, "directories will be parsed.\n\n");
    fprintf(stderr, "COMMANDS:\n");
    fprintf(stderr, "show     reads all snippets for <filename>.conf (in /usr/etc and /etc),\n");
    fprintf(stderr, "         and prints all groups,keys and their values.\n");
    fprintf(stderr, "         The root directories is /. It can be set by the environment\n");
    fprintf(stderr, "         variable $ECONFTOOL_ROOT \n");
    fprintf(stderr, "cat      prints the content of the files and the name of the file in the order\n");
    fprintf(stderr, "         as it has been read.\n");
    fprintf(stderr, "syntax   checks the syntax, prints parsing errors and returns 1 if an error\n");
    fprintf(stderr, "         has been found (otherwise 0).\n");
    fprintf(stderr, "         as it has been read.\n");
    fprintf(stderr, "edit     starts the editor $EDITOR (environment variable) where the\n");
    fprintf(stderr, "         groups, keys and values can be modified and saved afterwards.\n");
    fprintf(stderr, "  -f, --full:      copy the original configuration file to /etc instead of\n");
    fprintf(stderr, "                   creating drop-in files.\n");
    fprintf(stderr, "  --use-home:      only has an effect if the user is root.\n");
    fprintf(stderr, "                   chooses the root home directory instead of /etc.\n");
    fprintf(stderr, "revert   reverts all changes to the vendor versions. Basically deletes\n");
    fprintf(stderr, "         the config file and snippet directory in /etc.\n");
    fprintf(stderr, "  -y, --yes:       assumes yes for all prompts and runs non-interactively.\n\n");
    fprintf(stderr, "\ngeneral Options:\n");
    fprintf(stderr, "--comment <character>: Character which starts a comment. ('#' default).\n");
    fprintf(stderr, "--delimiters <string>: Characters which separates key/value entries. (\"=\" default).\n");
    fprintf(stderr, "                       e.g. --delimiters=\"= \\t\"\n");
    fprintf(stderr, "                       e.g. --delimiters=spaces   regarding all spaces\n");
}